

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileIoTests.c
# Opt level: O1

void runFileIOTests(void)

{
  _Bool _Var1;
  uint64_t uVar2;
  int_fast32_t iVar3;
  uint8_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint __fd;
  char cVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  printf("testFileExists()");
  _Var1 = exists((uint8_t *)"tests/simple_lines.dat");
  if (!_Var1) {
    __assert_fail("exists((uint8_t*)\"tests/simple_lines.dat\") == true",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/fileIoTests.c"
                  ,6,"void testFileExists()");
  }
  _Var1 = exists((uint8_t *)"tests/obviously_invalid_file");
  if (_Var1) {
    __assert_fail("exists((uint8_t*)\"tests/obviously_invalid_file\") == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/fileIoTests.c"
                  ,7,"void testFileExists()");
  }
  puts(" passed");
  printf("testGetSize()");
  uVar2 = getFileSize((uint8_t *)"tests/empty_file");
  if (uVar2 != 0) {
    __assert_fail("getFileSize((uint8_t*)\"tests/empty_file\") == 0LU",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/fileIoTests.c"
                  ,0xe,"void testGetFileSize()");
  }
  uVar2 = getFileSize((uint8_t *)"tests/null_file");
  if (uVar2 != 0) {
    __assert_fail("getFileSize((uint8_t*)\"tests/null_file\") == 0LU",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/fileIoTests.c"
                  ,0xf,"void testGetFileSize()");
  }
  uVar2 = getFileSize((uint8_t *)"tests/simple_lines.dat");
  if (uVar2 != 0x870) {
    __assert_fail("getFileSize((uint8_t*)\"tests/simple_lines.dat\") == 2160LU",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/fileIoTests.c"
                  ,0x10,"void testGetFileSize()");
  }
  puts(" passed");
  printf("testReadBlock()");
  iVar3 = openForRead((uint8_t *)"tests/simple_lines.dat");
  __fd = (uint)iVar3;
  if ((int)__fd < 1) {
    __assert_fail("read > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/fileIoTests.c"
                  ,0x18,"void testReadBytes()");
  }
  uVar2 = getFileSize((uint8_t *)"tests/simple_lines.dat");
  if (uVar2 != 0) {
    do {
      puVar4 = readBytes(0x1b,(ulong)(__fd & 0x7fffffff));
      auVar9[0] = -(*puVar4 == 'a');
      auVar9[1] = -(puVar4[1] == 'b');
      auVar9[2] = -(puVar4[2] == 'c');
      auVar9[3] = -(puVar4[3] == 'd');
      auVar9[4] = -(puVar4[4] == 'e');
      auVar9[5] = -(puVar4[5] == 'f');
      auVar9[6] = -(puVar4[6] == 'g');
      auVar9[7] = -(puVar4[7] == 'h');
      auVar9[8] = -(puVar4[8] == 'i');
      auVar9[9] = -(puVar4[9] == 'j');
      auVar9[10] = -(puVar4[10] == 'k');
      auVar9[0xb] = -(puVar4[0xb] == 'l');
      auVar9[0xc] = -(puVar4[0xc] == 'm');
      auVar9[0xd] = -(puVar4[0xd] == 'n');
      auVar9[0xe] = -(puVar4[0xe] == 'o');
      auVar9[0xf] = -(puVar4[0xf] == 'p');
      auVar10[0] = -(puVar4[0xb] == 'l');
      auVar10[1] = -(puVar4[0xc] == 'm');
      auVar10[2] = -(puVar4[0xd] == 'n');
      auVar10[3] = -(puVar4[0xe] == 'o');
      auVar10[4] = -(puVar4[0xf] == 'p');
      auVar10[5] = -(puVar4[0x10] == 'q');
      auVar10[6] = -(puVar4[0x11] == 'r');
      auVar10[7] = -(puVar4[0x12] == 's');
      auVar10[8] = -(puVar4[0x13] == 't');
      auVar10[9] = -(puVar4[0x14] == 'u');
      auVar10[10] = -(puVar4[0x15] == 'v');
      auVar10[0xb] = -(puVar4[0x16] == 'w');
      auVar10[0xc] = -(puVar4[0x17] == 'x');
      auVar10[0xd] = -(puVar4[0x18] == 'y');
      auVar10[0xe] = -(puVar4[0x19] == 'z');
      auVar10[0xf] = -(puVar4[0x1a] == '\n');
      auVar10 = auVar10 & auVar9;
      if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) != 0xffff) {
        __assert_fail("memcmp(line, REF_LINE, TEST_FILE_LINE_LENGTH) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/fileIoTests.c"
                      ,0x1e,"void testReadBytes()");
      }
      if (puVar4 != (uint8_t *)0x0) {
        free(puVar4);
      }
      uVar2 = uVar2 - 0x1b;
    } while (uVar2 != 0);
  }
  puts(" passed");
  close(__fd);
  printf("testWriteBytes()");
  uVar5 = openForWrite((uint8_t *)"writeTest.dat");
  uVar6 = openForRead((uint8_t *)"writeTest.dat");
  if (0 < (int)uVar5) {
    if ((int)uVar6 < 1) {
      __assert_fail("re_fd > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/fileIoTests.c"
                    ,0x33,"void testWriteBytes()");
    }
    cVar8 = '\0';
    do {
      _Var1 = writeBytes("abcdefghijklmnoprqstuvwxyz\nskein_state.skeinSize == 256",0x1b,
                         uVar5 & 0x7fffffff);
      if (!_Var1) {
        __assert_fail("writeBytes(alphabet, a_size, wr_fd) == true",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/fileIoTests.c"
                      ,0x37,"void testWriteBytes()");
      }
      puVar4 = readBytes(0x1b,uVar6 & 0x7fffffff);
      if (puVar4 == (uint8_t *)0x0) {
        __assert_fail("data != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/fileIoTests.c"
                      ,0x3a,"void testWriteBytes()");
      }
      lVar7 = 0;
      do {
        if (puVar4[lVar7] != (&testWriteBytes_alphabet)[lVar7]) {
          __assert_fail("data[j] == alphabet[j]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/fileIoTests.c"
                        ,0x3d,"void testWriteBytes()");
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x1b);
      free(puVar4);
      cVar8 = cVar8 + '\x01';
    } while (cVar8 != '\x1a');
    uVar2 = getFileSize((uint8_t *)"writeTest.dat");
    if (uVar2 == 0x2be) {
      puts(" passed");
      close((int)uVar5);
      close((int)uVar6);
      return;
    }
    __assert_fail("getFileSize((uint8_t*)\"writeTest.dat\") == 702",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/fileIoTests.c"
                  ,0x42,"void testWriteBytes()");
  }
  __assert_fail("wr_fd > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/test/fileIoTests.c"
                ,0x32,"void testWriteBytes()");
}

Assistant:

static void testFileExists()
{
    printf("testFileExists()");
    assert(exists((uint8_t*)"tests/simple_lines.dat") == true);
    assert(exists((uint8_t*)"tests/obviously_invalid_file") == false);
    printf(" passed\n");
}